

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  FastFieldValuePrinter *pFVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *puVar5;
  _Rb_tree_header *p_Var6;
  Message *pMVar7;
  _Base_ptr p_Var8;
  pointer ppMVar9;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *puVar10;
  char *pcVar11;
  pointer ppMVar12;
  ulong uVar13;
  ulong uVar14;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  sorted_map_field;
  DynamicMessageFactory factory;
  uint local_e4;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  local_b8;
  _Rb_tree_header *local_98;
  FieldDescriptor *local_90;
  _func_void_FieldDescriptor_ptr *local_88;
  ulong local_80;
  DynamicMessageFactory local_78;
  
  if ((this->use_short_repeated_primitives_ == true) && (*(int *)(field + 0x3c) == 3)) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_78.super_MessageFactory._vptr_MessageFactory =
           (_func_int **)FieldDescriptor::TypeOnceInit;
      local_b8.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_78,
                 (FieldDescriptor **)&local_b8);
    }
    iVar4 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
    if (iVar4 != 9) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_78.super_MessageFactory._vptr_MessageFactory =
             (_func_int **)FieldDescriptor::TypeOnceInit;
        local_b8.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_78,
                   (FieldDescriptor **)&local_b8);
        iVar4 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
      }
      if (iVar4 != 10) {
        PrintShortRepeatedField(this,message,reflection,field,generator);
        return;
      }
    }
  }
  if (*(int *)(field + 0x3c) == 3) {
    local_e4 = Reflection::FieldSize(reflection,message,field);
  }
  else {
    bVar3 = Reflection::HasField(reflection,message,field);
    if ((bVar3) ||
       (local_e4 = 0, *(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\x01')) {
      local_e4 = 1;
    }
  }
  DynamicMessageFactory::DynamicMessageFactory(&local_78);
  local_b8.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_88 = FieldDescriptor::TypeOnceInit;
    local_90 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_88,&local_90);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar3 = FieldDescriptor::is_map_message_type(field), bVar3)) {
    bVar3 = internal::MapFieldPrinterHelper::SortMap
                      (message,reflection,field,&local_78.super_MessageFactory,&local_b8);
    bVar2 = true;
  }
  else {
    bVar2 = false;
    bVar3 = false;
  }
  if (0 < (int)local_e4) {
    local_98 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
    puVar5 = &this->default_field_value_printer_;
    local_80 = (ulong)local_e4;
    uVar14 = 0;
    do {
      uVar13 = 0xffffffff;
      if (*(int *)(field + 0x3c) == 3) {
        uVar13 = uVar14 & 0xffffffff;
      }
      PrintFieldName(this,message,(int)uVar13,local_e4,reflection,field,generator);
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_88 = FieldDescriptor::TypeOnceInit;
        local_90 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),&local_88,&local_90);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
        p_Var8 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = local_98;
        puVar10 = puVar5;
        if (p_Var8 != (_Base_ptr)0x0) {
          do {
            if (*(FieldDescriptor **)(p_Var8 + 1) >= field) {
              p_Var6 = (_Rb_tree_header *)p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[*(FieldDescriptor **)(p_Var8 + 1) < field];
          } while (p_Var8 != (_Base_ptr)0x0);
          if ((p_Var6 != local_98) &&
             (puVar10 = (unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                         *)(p_Var6 + 1), field < (FieldDescriptor *)p_Var6->_M_node_count)) {
            puVar10 = puVar5;
          }
        }
        pFVar1 = (puVar10->_M_t).
                 super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                 .
                 super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>
                 ._M_head_impl;
        if (*(int *)(field + 0x3c) == 3) {
          if (bVar2) {
            pMVar7 = local_b8.
                     super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14];
          }
          else {
            pMVar7 = Reflection::GetRepeatedMessage(reflection,message,field,(int)uVar14);
          }
        }
        else {
          pMVar7 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
        }
        (*pFVar1->_vptr_FastFieldValuePrinter[0xe])
                  (pFVar1,pMVar7,uVar13,(ulong)local_e4,(ulong)this->single_line_mode_,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        Print(this,pMVar7,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])(generator);
        (*pFVar1->_vptr_FastFieldValuePrinter[0xf])
                  (pFVar1,pMVar7,uVar13,(ulong)local_e4,(ulong)this->single_line_mode_,generator);
      }
      else {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
        PrintFieldValue(this,message,reflection,field,(int)uVar13,generator);
        pcVar11 = "\n";
        if (this->single_line_mode_ != false) {
          pcVar11 = " ";
        }
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,pcVar11,1);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_80);
  }
  ppMVar12 = local_b8.
             super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((bVar3 != false) &&
     (local_b8.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_b8.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    uVar14 = 0;
    ppMVar9 = local_b8.
              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pMVar7 = ppMVar12[uVar14];
      if (pMVar7 != (Message *)0x0) {
        (*(pMVar7->super_MessageLite)._vptr_MessageLite[1])(pMVar7);
        ppMVar9 = local_b8.
                  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppMVar12 = local_b8.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)ppMVar9 - (long)ppMVar12 >> 3));
  }
  if (ppMVar12 != (pointer)0x0) {
    operator_delete(ppMVar12);
  }
  DynamicMessageFactory::~DynamicMessageFactory(&local_78);
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator* generator) const {
  if (use_short_repeated_primitives_ && field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field) ||
             field->containing_type()->options().map_entry()) {
    count = 1;
  }

  DynamicMessageFactory factory;
  std::vector<const Message*> sorted_map_field;
  bool need_release = false;
  bool is_map = field->is_map();
  if (is_map) {
    need_release = internal::MapFieldPrinterHelper::SortMap(
        message, reflection, field, &factory, &sorted_map_field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, field_index, count, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FastFieldValuePrinter* printer = GetFieldPrinter(field);
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *sorted_map_field[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      printer->PrintMessageStart(sub_message, field_index, count,
                                 single_line_mode_, generator);
      generator->Indent();
      Print(sub_message, generator);
      generator->Outdent();
      printer->PrintMessageEnd(sub_message, field_index, count,
                               single_line_mode_, generator);
    } else {
      generator->PrintLiteral(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator->PrintLiteral(" ");
      } else {
        generator->PrintLiteral("\n");
      }
    }
  }

  if (need_release) {
    for (int j = 0; j < sorted_map_field.size(); ++j) {
      delete sorted_map_field[j];
    }
  }
}